

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_general.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_140 [8];
  TestMaterial clone_universe;
  undefined1 local_a0 [8];
  TestMaterial universe;
  
  universe._140_4_ = 0;
  TestMaterial::TestMaterial((TestMaterial *)local_a0,true);
  TestMaterial::initializeUniverse((TestMaterial *)local_a0);
  TestMaterial::GeneralTest((TestMaterial *)local_a0);
  TestMaterial::TestMaterial((TestMaterial *)local_140,true);
  CloneUniverse((TestMaterial *)local_a0,(TestMaterial *)local_140);
  TestMaterial::GeneralTest((TestMaterial *)local_140);
  TestMaterial::~TestMaterial((TestMaterial *)local_140);
  universe._140_4_ = 0;
  TestMaterial::~TestMaterial((TestMaterial *)local_a0);
  return universe._140_4_;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(NON_STP_BV_OBJECTS);
  universe.initializeUniverse();
  universe.GeneralTest();
  {
    TestMaterial clone_universe(NON_STP_BV_OBJECTS);
    CloneUniverse(universe, clone_universe);
    clone_universe.GeneralTest();
  }
  return 0;
}